

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O0

void __thiscall
helics::BrokerApp::BrokerApp
          (BrokerApp *this,CoreType ctype,string *broker_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ParseOutput PVar1;
  pointer phVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  CoreType in_ESI;
  long in_RDI;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *this_00;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  undefined4 in_stack_00000048;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000068;
  helicsCLI11App *in_stack_00000070;
  bool in_stack_00000087;
  BrokerApp *in_stack_00000088;
  undefined4 in_stack_fffffffffffffff0;
  
  CLI::std::shared_ptr<helics::Broker>::shared_ptr((shared_ptr<helics::Broker> *)0x44704e);
  this_00 = (unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
            (in_RDI + 0x10);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  generateParser(in_stack_00000088,in_stack_00000087);
  phVar2 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x447090);
  helicsCLI11App::setDefaultCoreType(phVar2,in_ESI);
  phVar2 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x4470a8);
  phVar2->passConfig = true;
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x4470b9);
  PVar1 = helicsCLI11App::
          helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                    (in_stack_00000070,in_stack_00000068);
  if (PVar1 == OK) {
    processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                      *)CONCAT44(ctype,in_stack_00000048));
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr(this_00);
  return;
}

Assistant:

BrokerApp::BrokerApp(CoreType ctype,
                     const std::string& broker_name,
                     std::vector<std::string>& args): name(broker_name)
{
    auto app = generateParser(ctype == CoreType::MULTI);
    app->setDefaultCoreType(ctype);
    app->passConfig = true;
    if (app->helics_parse(args) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}